

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::NumberPairSet::NumberPairSet(NumberPairSet *this)

{
  NumberPairSet *this_local;
  
  JsUtil::
  BaseHashSet<Js::NumberPair,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::NumberPair,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->set,(AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,0);
  return;
}

Assistant:

NumberPairSet::NumberPairSet() : set(&NoCheckHeapAllocator::Instance) {}